

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O0

void __thiscall ki::dml::Record::from_xml(Record *this,xml_node<char> *node)

{
  mapped_type pFVar1;
  FieldBase *pFVar2;
  FieldBase *pFVar3;
  bool bVar4;
  node_type nVar5;
  char *pcVar6;
  ostream *poVar7;
  value_error *this_00;
  mapped_type *ppFVar8;
  reference ppFVar9;
  undefined1 local_290 [32];
  __normal_iterator<ki::dml::FieldBase_**,_std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>_>
  local_270;
  FieldBase **local_268;
  __normal_iterator<ki::dml::FieldBase_**,_std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>_>
  local_260;
  __normal_iterator<ki::dml::FieldBase_**,_std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>_>
  local_258;
  size_type local_250;
  ptrdiff_t index;
  mapped_type local_228;
  FieldBase *old_field;
  FieldBase *local_200;
  FieldBase *field;
  xml_node<char> *field_node;
  string local_1e8 [32];
  ostringstream local_1c8 [8];
  ostringstream oss;
  allocator local_39;
  string local_38 [8];
  string node_name;
  xml_node<char> *node_local;
  Record *this_local;
  
  pcVar6 = rapidxml::xml_base<char>::name(&node->super_xml_base<char>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar6,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"RECORD");
  if (bVar4) {
    std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar7 = std::operator<<((ostream *)local_1c8,"Expected <RECORD> node but got <");
    pcVar6 = rapidxml::xml_base<char>::name(&node->super_xml_base<char>);
    poVar7 = std::operator<<(poVar7,pcVar6);
    std::operator<<(poVar7,">.");
    field_node._7_1_ = 1;
    this_00 = (value_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    value_error::value_error(this_00,local_1e8);
    field_node._7_1_ = 0;
    __cxa_throw(this_00,&value_error::typeinfo,value_error::~value_error);
  }
  for (field = (FieldBase *)rapidxml::xml_node<char>::first_node(node,(char *)0x0,0,true);
      field != (FieldBase *)0x0;
      field = (FieldBase *)
              rapidxml::xml_node<char>::next_sibling((xml_node<char> *)field,(char *)0x0,0,true)) {
    nVar5 = rapidxml::xml_node<char>::type((xml_node<char> *)field);
    if (nVar5 == node_element) {
      local_200 = FieldBase::create_from_xml((xml_node<char> *)field);
      FieldBase::get_name_abi_cxx11_((FieldBase *)&old_field);
      bVar4 = has_field(this,(string *)&old_field);
      std::__cxx11::string::~string((string *)&old_field);
      if (bVar4) {
        FieldBase::get_name_abi_cxx11_((FieldBase *)&index);
        ppFVar8 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
                  ::at(&this->m_field_map,(key_type *)&index);
        pFVar1 = *ppFVar8;
        std::__cxx11::string::~string((string *)&index);
        local_228 = pFVar1;
        if (local_200->m_type_hash == pFVar1->m_type_hash) {
          (*(pFVar1->super_Serializable)._vptr_Serializable[0xb])(pFVar1,local_200);
          if (local_200 != (value_type)0x0) {
            (*(local_200->super_Serializable)._vptr_Serializable[4])();
          }
        }
        else {
          local_260._M_current =
               (FieldBase **)
               std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>::begin
                         (&this->m_fields);
          local_268 = (FieldBase **)
                      std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>::end
                                (&this->m_fields);
          local_258 = std::
                      find<__gnu_cxx::__normal_iterator<ki::dml::FieldBase**,std::vector<ki::dml::FieldBase*,std::allocator<ki::dml::FieldBase*>>>,ki::dml::FieldBase*>
                                (local_260,
                                 (__normal_iterator<ki::dml::FieldBase_**,_std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>_>
                                  )local_268,&local_228);
          local_270._M_current =
               (FieldBase **)
               std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>::begin
                         (&this->m_fields);
          local_250 = __gnu_cxx::operator-(&local_258,&local_270);
          pFVar2 = local_200;
          ppFVar9 = std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>::
                    operator[](&this->m_fields,local_250);
          pFVar3 = local_200;
          *ppFVar9 = pFVar2;
          FieldBase::get_name_abi_cxx11_((FieldBase *)local_290);
          ppFVar8 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
                    ::operator[](&this->m_field_map,(key_type *)local_290);
          *ppFVar8 = pFVar3;
          std::__cxx11::string::~string((string *)local_290);
          if (local_228 != (mapped_type)0x0) {
            (*(local_228->super_Serializable)._vptr_Serializable[4])();
          }
        }
      }
      else {
        add_field(this,local_200);
      }
    }
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Record::from_xml(rapidxml::xml_node<> *node)
	{
		// Make sure that we've been passed a <RECORD> element.
		const std::string node_name = node->name();
		if (node_name != "RECORD")
		{
			std::ostringstream oss;
			oss << "Expected <RECORD> node but got <" << node->name() << ">.";
			throw value_error(oss.str());
		}

		// Every child node inside a <RECORD> element is a Field.
		for (auto *field_node = node->first_node();
			field_node; field_node = field_node->next_sibling())
		{
			if (field_node->type() != rapidxml::node_type::node_element)
				continue;

			FieldBase *field = FieldBase::create_from_xml(field_node);
			if (has_field(field->get_name()))
			{
				// Is the old field the same type as the one created from
				// the XML data?
				FieldBase *old_field = m_field_map.at(field->get_name());
				if (field->m_type_hash == old_field->m_type_hash)
				{
					// Set the value of the old field to the value of the new
					// one.
					old_field->set_value(field);
					delete field;
				}
				else
				{
					// Since the types are different, we can't set the value
					// of the old field to the value of the new one so,
					// replace the old field with this new one instead.
					const std::ptrdiff_t index = std::find(
						m_fields.begin(), m_fields.end(), old_field) - m_fields.begin();
					m_fields[index] = field;
					m_field_map[field->get_name()] = field;
					delete old_field;
				}
			}
			else
				add_field(field);
		}
	}